

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeDValue cellArea(Rtree *pRtree,RtreeCell *p)

{
  double local_20;
  RtreeDValue area;
  RtreeCell *p_local;
  Rtree *pRtree_local;
  
  local_20 = 1.0;
  if (pRtree->eCoordType == '\0') {
    switch(pRtree->nDim) {
    case '\x05':
      local_20 = (double)(p->aCoord[9].f - p->aCoord[8].f);
    case '\x04':
      local_20 = (double)(p->aCoord[7].f - p->aCoord[6].f) * local_20;
    case '\x03':
      local_20 = (double)(p->aCoord[5].f - p->aCoord[4].f) * local_20;
    case '\x02':
      local_20 = (double)(p->aCoord[3].f - p->aCoord[2].f) * local_20;
    default:
      local_20 = (double)(p->aCoord[1].f - p->aCoord[0].f) * local_20;
    }
  }
  else {
    switch(pRtree->nDim) {
    case '\x05':
      local_20 = (double)((long)p->aCoord[9].i - (long)p->aCoord[8].i);
    case '\x04':
      local_20 = (double)((long)p->aCoord[7].i - (long)p->aCoord[6].i) * local_20;
    case '\x03':
      local_20 = (double)((long)p->aCoord[5].i - (long)p->aCoord[4].i) * local_20;
    case '\x02':
      local_20 = (double)((long)p->aCoord[3].i - (long)p->aCoord[2].i) * local_20;
    default:
      local_20 = (double)((long)p->aCoord[1].i - (long)p->aCoord[0].i) * local_20;
    }
  }
  return local_20;
}

Assistant:

static RtreeDValue cellArea(Rtree *pRtree, RtreeCell *p){
  RtreeDValue area = (RtreeDValue)1;
  assert( pRtree->nDim>=1 && pRtree->nDim<=5 );
#ifndef SQLITE_RTREE_INT_ONLY
  if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
    switch( pRtree->nDim ){
      case 5:  area  = p->aCoord[9].f - p->aCoord[8].f;
      case 4:  area *= p->aCoord[7].f - p->aCoord[6].f;
      case 3:  area *= p->aCoord[5].f - p->aCoord[4].f;
      case 2:  area *= p->aCoord[3].f - p->aCoord[2].f;
      default: area *= p->aCoord[1].f - p->aCoord[0].f;
    }
  }else
#endif
  {
    switch( pRtree->nDim ){
      case 5:  area  = (i64)p->aCoord[9].i - (i64)p->aCoord[8].i;
      case 4:  area *= (i64)p->aCoord[7].i - (i64)p->aCoord[6].i;
      case 3:  area *= (i64)p->aCoord[5].i - (i64)p->aCoord[4].i;
      case 2:  area *= (i64)p->aCoord[3].i - (i64)p->aCoord[2].i;
      default: area *= (i64)p->aCoord[1].i - (i64)p->aCoord[0].i;
    }
  }
  return area;
}